

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall QStyleSheetStyle::~QStyleSheetStyle(QStyleSheetStyle *this)

{
  QStyleSheetStyle *in_RDI;
  
  ~QStyleSheetStyle(in_RDI);
  operator_delete(in_RDI,0x60);
  return;
}

Assistant:

QStyleSheetStyle::~QStyleSheetStyle()
{
    --numinstances;
    if (numinstances == 0) {
        delete styleSheetCaches;
    }
}